

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O1

void __thiscall AndMeaning::TracePointers(AndMeaning *this,function<void_(Sexp_**)> *func)

{
  pointer ppSVar1;
  pointer ppSVar2;
  pointer local_30;
  
  ppSVar2 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->arguments).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar1) {
    do {
      local_30 = ppSVar2;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*func->_M_invoker)((_Any_data *)func,&local_30);
      ppSVar2 = ppSVar2 + 1;
    } while (ppSVar2 != ppSVar1);
  }
  return;
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    for (auto &arg : arguments) {
      func(&arg);
    }
  }